

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::NoShaders::Run(NoShaders *this)

{
  uint uVar1;
  GLuint program;
  uint *puVar2;
  long lVar3;
  allocator<char> local_61;
  long error;
  CallLogWrapper *local_58;
  string local_50 [32];
  
  local_58 = &(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(local_58);
  error = 0;
  puVar2 = &glcts::(anonymous_namespace)::PIQBase::interfaces;
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 4) {
    uVar1 = *(uint *)((long)&glcts::(anonymous_namespace)::PIQBase::interfaces + lVar3);
    (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
              (this,(ulong)program,(ulong)uVar1,0x92f5,0,&error);
    if (lVar3 != 0x18) {
      (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
                (this,(ulong)program,(ulong)uVar1,0x92f6,0,&error);
    }
  }
  lVar3 = 0;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92c0,0x92f7,0,&error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e6,0x92f7,0,&error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e2,0x92f7,0,&error);
  do {
    if (lVar3 != 6) {
      if (lVar3 == 8) {
        glu::CallLogWrapper::glDeleteProgram(local_58,program);
        return error;
      }
      uVar1 = *puVar2;
      std::__cxx11::string::string<std::allocator<char>>
                (local_50,fixed_sample_locations_values + 1,&local_61);
      (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe])
                (this,(ulong)program,(ulong)uVar1,local_50,0xffffffffffffffff,&error);
      std::__cxx11::string::~string(local_50);
    }
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		const GLuint program = glCreateProgram();

		long error = NO_ERROR;
		int  size  = sizeof(PIQBase::interfaces) / sizeof(PIQBase::interfaces[0]);

		for (int i = 0; i < size; ++i)
		{
			VerifyGetProgramInterfaceiv(program, PIQBase::interfaces[i], GL_ACTIVE_RESOURCES, 0, error);
			if (PIQBase::interfaces[i] == GL_ATOMIC_COUNTER_BUFFER)
				continue;
			VerifyGetProgramInterfaceiv(program, PIQBase::interfaces[i], GL_MAX_NAME_LENGTH, 0, error);
		}
		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);
		VerifyGetProgramInterfaceiv(program, GL_SHADER_STORAGE_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);

		for (int i = 0; i < size; ++i)
		{
			if (PIQBase::interfaces[i] == GL_ATOMIC_COUNTER_BUFFER)
				continue;
			VerifyGetProgramResourceIndex(program, PIQBase::interfaces[i], "", GL_INVALID_INDEX, error);
		}

		// can't test GetProgramResourceLocation* here since program has to be linked
		// can't test GetProgramResourceiv, need valid index

		glDeleteProgram(program);
		return error;
	}